

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_shift_right(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  size_t sVar4;
  size_t sVar5;
  bitset_t *pbVar6;
  size_t sVar7;
  long lVar8;
  bitset_t *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong auStack_168 [5];
  bitset_t *pbStack_140;
  bitset_t *pbStack_138;
  code *pcStack_130;
  bitset_t *pbStack_120;
  undefined8 uStack_118;
  bitset_t *pbStack_110;
  code *pcStack_108;
  bitset_t *pbStack_f8;
  bitset_t *pbStack_f0;
  bitset_t *pbStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  bitset_t *pbStack_d0;
  code *pcStack_c8;
  bitset_t *pbStack_c0;
  long lStack_b8;
  ulong uStack_b0;
  bitset_t *pbStack_a8;
  code *pcStack_a0;
  bitset_t *pbStack_90;
  ulong uStack_88;
  ulong uStack_80;
  bitset_t *pbStack_78;
  long lStack_70;
  code *pcStack_68;
  size_t sStack_60;
  long lStack_58;
  long lStack_50;
  bitset_t *pbStack_48;
  code *pcStack_40;
  size_t local_38;
  
  lVar15 = 0;
  lVar16 = 0;
  local_38 = 0;
  do {
    lVar10 = 300;
    pcStack_40 = (code *)0x101db3;
    pbVar3 = bitset_create();
    do {
      uVar19 = (ulong)(lVar16 + lVar10) >> 6;
      if (uVar19 < pbVar3->arraysize) {
LAB_00101dd9:
        pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)(lVar16 + lVar10) & 0x3f);
      }
      else {
        pcStack_40 = (code *)0x101dd5;
        _Var2 = bitset_grow(pbVar3,uVar19 + 1);
        if (_Var2) goto LAB_00101dd9;
      }
      lVar10 = lVar10 + 3;
    } while (lVar10 != 0x3bc4);
    pcStack_40 = (code *)0x101dff;
    sVar4 = bitset_count(pbVar3);
    sVar7 = local_38;
    pcStack_40 = (code *)0x101e11;
    bitset_shift_right(pbVar3,local_38);
    pcStack_40 = (code *)0x101e19;
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != sVar4) {
LAB_00101e85:
      pcStack_40 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_60 = sVar7;
      pcStack_68 = (code *)0x101e98;
      lStack_58 = lVar15;
      lStack_50 = lVar16;
      pbStack_48 = pbVar3;
      pcStack_40 = (code *)sVar4;
      pbVar3 = bitset_create();
      lVar15 = 0;
      pcStack_68 = (code *)0x101ea3;
      pbVar6 = bitset_create();
      uVar19 = 0;
      break;
    }
    lVar8 = 300;
    do {
      uVar19 = (ulong)(lVar15 + lVar8) >> 6;
      if ((pbVar3->arraysize <= uVar19) ||
         ((pbVar3->array[uVar19] >> (lVar15 + lVar8 & 0x3fU) & 1) == 0)) {
        pcStack_40 = (code *)0x101e85;
        test_shift_right_cold_2();
        goto LAB_00101e85;
      }
      lVar8 = lVar8 + 3;
    } while (lVar8 != 0x3bc4);
    pcStack_40 = (code *)0x101e59;
    bitset_free(pbVar3);
    local_38 = sVar7 + 1;
    lVar16 = lVar16 + 3;
    lVar15 = lVar15 + 2;
    if (local_38 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar15 = lVar15 + 2;
    if (uVar19 == 1000) break;
    uVar17 = uVar19 >> 5;
    if (uVar17 < pbVar3->arraysize) {
LAB_00101ec6:
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)lVar15 & 0x3e);
    }
    else {
      pcStack_68 = (code *)0x101ec2;
      _Var2 = bitset_grow(pbVar3,uVar17 + 1);
      if (_Var2) goto LAB_00101ec6;
    }
    if (uVar17 < pbVar6->arraysize) {
LAB_00101ef1:
      pbVar6->array[uVar17] = pbVar6->array[uVar17] | 2L << ((byte)lVar15 & 0x3e);
    }
    else {
      pcStack_68 = (code *)0x101eed;
      _Var2 = bitset_grow(pbVar6,uVar17 + 1);
      if (_Var2) goto LAB_00101ef1;
    }
  }
  pcStack_68 = (code *)0x101f21;
  bitset_inplace_symmetric_difference(pbVar3,pbVar6);
  pcStack_68 = (code *)0x101f29;
  sVar7 = bitset_count(pbVar3);
  if (sVar7 == 2000) {
    pcStack_68 = (code *)0x101f40;
    bitset_inplace_symmetric_difference(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101f48;
    sVar7 = bitset_count(pbVar3);
    if (sVar7 != 1000) goto LAB_00102002;
    pcStack_68 = (code *)0x101f5f;
    bitset_inplace_difference(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101f67;
    sVar7 = bitset_count(pbVar3);
    if (sVar7 != 1000) goto LAB_00102007;
    pcStack_68 = (code *)0x101f7e;
    bitset_inplace_union(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101f86;
    sVar7 = bitset_count(pbVar3);
    if (sVar7 != 2000) goto LAB_0010200c;
    pcStack_68 = (code *)0x101f99;
    bitset_inplace_intersection(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101fa1;
    sVar7 = bitset_count(pbVar3);
    if (sVar7 != 1000) goto LAB_00102011;
    pcStack_68 = (code *)0x101fb4;
    bitset_inplace_difference(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101fbc;
    sVar7 = bitset_count(pbVar3);
    if (sVar7 != 0) goto LAB_00102016;
    pcStack_68 = (code *)0x101fcc;
    bitset_inplace_union(pbVar3,pbVar6);
    pcStack_68 = (code *)0x101fd7;
    bitset_inplace_difference(pbVar6,pbVar3);
    pcStack_68 = (code *)0x101fdf;
    sVar7 = bitset_count(pbVar6);
    if (sVar7 == 0) {
      pcStack_68 = (code *)0x101fec;
      bitset_free(pbVar3);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_68 = (code *)0x102002;
    test_union_intersection_cold_1();
LAB_00102002:
    pcStack_68 = (code *)0x102007;
    test_union_intersection_cold_2();
LAB_00102007:
    pcStack_68 = (code *)0x10200c;
    test_union_intersection_cold_3();
LAB_0010200c:
    pcStack_68 = (code *)0x102011;
    test_union_intersection_cold_4();
LAB_00102011:
    pcStack_68 = (code *)0x102016;
    test_union_intersection_cold_5();
LAB_00102016:
    pcStack_68 = (code *)0x10201b;
    test_union_intersection_cold_6();
  }
  pcStack_68 = test_counts;
  test_union_intersection_cold_7();
  pcStack_a0 = (code *)0x102030;
  pbStack_90 = pbVar3;
  uStack_88 = uVar19;
  uStack_80 = uVar17;
  pbStack_78 = pbVar6;
  lStack_70 = lVar15;
  pcStack_68 = (code *)lVar10;
  pbVar3 = bitset_create();
  lVar15 = 0;
  pcStack_a0 = (code *)0x10203b;
  pbVar6 = bitset_create();
  uVar17 = 0;
  uVar19 = 0;
  do {
    uVar11 = uVar19 >> 5;
    if (uVar11 < pbVar3->arraysize) {
LAB_00102061:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)lVar15 & 0x3e);
    }
    else {
      pcStack_a0 = (code *)0x10205d;
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_00102061;
    }
    uVar11 = uVar17 >> 6;
    if (uVar11 < pbVar6->arraysize) {
LAB_00102093:
      pbVar6->array[uVar11] = pbVar6->array[uVar11] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      pcStack_a0 = (code *)0x10208f;
      _Var2 = bitset_grow(pbVar6,uVar11 + 1);
      if (_Var2) goto LAB_00102093;
    }
    uVar19 = uVar19 + 1;
    uVar17 = uVar17 + 3;
    lVar15 = lVar15 + 2;
  } while (uVar19 != 1000);
  pcStack_a0 = (code *)0x1020c4;
  sVar7 = bitset_intersection_count(pbVar3,pbVar6);
  if (sVar7 == 0x14e) {
    pcStack_a0 = (code *)0x1020d7;
    sVar7 = bitset_union_count(pbVar3,pbVar6);
    if (sVar7 == 0x682) {
      pcStack_a0 = (code *)0x1020e7;
      bitset_free(pbVar3);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x102102;
    test_counts_cold_1();
  }
  pcStack_a0 = test_disjoint;
  test_counts_cold_2();
  pcStack_c8 = (code *)0x102115;
  pbStack_c0 = pbVar3;
  lStack_b8 = lVar15;
  uStack_b0 = uVar19;
  pbStack_a8 = pbVar6;
  pcStack_a0 = (code *)uVar17;
  pbVar3 = bitset_create();
  uVar19 = 0;
  pcStack_c8 = (code *)0x102120;
  pbVar6 = bitset_create();
  do {
    uVar17 = uVar19 >> 6;
    if ((uVar19 & 1) == 0) {
      uVar11 = 0x3e;
      pbVar9 = pbVar3;
      if (uVar17 < pbVar3->arraysize) goto LAB_00102176;
      pcStack_c8 = (code *)0x10215e;
      _Var2 = bitset_grow(pbVar3,uVar17 + 1);
LAB_00102172:
      if (_Var2 != false) goto LAB_00102176;
    }
    else {
      uVar11 = 0x3f;
      pbVar9 = pbVar6;
      if (pbVar6->arraysize <= uVar17) {
        pcStack_c8 = (code *)0x10216f;
        _Var2 = bitset_grow(pbVar6,uVar17 + 1);
        goto LAB_00102172;
      }
LAB_00102176:
      uVar18 = (uint)uVar11 & (uint)uVar19;
      uVar11 = (ulong)uVar18;
      pbVar9->array[uVar17] = pbVar9->array[uVar17] | 1L << (sbyte)uVar18;
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 1000);
  pcStack_c8 = (code *)0x1021a2;
  _Var2 = bitsets_disjoint(pbVar3,pbVar6);
  if (_Var2) {
    uVar11 = 0x20000000000000;
    if (pbVar3->arraysize < 8) {
      pcStack_c8 = (code *)0x1021c4;
      _Var2 = bitset_grow(pbVar3,8);
      if (_Var2) goto LAB_001021c8;
    }
    else {
LAB_001021c8:
      pbVar3->array[7] = pbVar3->array[7] | 0x20000000000000;
    }
    if (pbVar6->arraysize < 8) {
      pcStack_c8 = (code *)0x1021e3;
      _Var2 = bitset_grow(pbVar6,8);
      if (_Var2) goto LAB_001021e7;
    }
    else {
LAB_001021e7:
      pbVar6->array[7] = pbVar6->array[7] | 0x20000000000000;
    }
    pcStack_c8 = (code *)0x1021f9;
    _Var2 = bitsets_disjoint(pbVar3,pbVar6);
    if (!_Var2) {
      pcStack_c8 = (code *)0x102205;
      bitset_free(pbVar3);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_c8 = (code *)0x10221b;
    test_disjoint_cold_1();
  }
  pcStack_c8 = test_intersects;
  test_disjoint_cold_2();
  pbStack_f0 = (bitset_t *)0x10222e;
  pbStack_e8 = pbVar3;
  uStack_e0 = uVar19;
  uStack_d8 = uVar17;
  pbStack_d0 = pbVar6;
  pcStack_c8 = (code *)uVar11;
  pbVar3 = bitset_create();
  pbStack_f0 = (bitset_t *)0x102236;
  pbVar6 = bitset_create();
  pbStack_f0 = (bitset_t *)0x102241;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar19 = 0;
    do {
      uVar17 = uVar19 >> 6;
      if ((uVar19 & 1) == 0) {
        uVar11 = 0x3e;
        pbVar9 = pbVar3;
        if (uVar17 < pbVar3->arraysize) goto LAB_0010229f;
        pbStack_f0 = (bitset_t *)0x102287;
        _Var2 = bitset_grow(pbVar3,uVar17 + 1);
LAB_0010229b:
        if (_Var2 != false) goto LAB_0010229f;
      }
      else {
        uVar11 = 0x3f;
        pbVar9 = pbVar6;
        if (pbVar6->arraysize <= uVar17) {
          pbStack_f0 = (bitset_t *)0x102298;
          _Var2 = bitset_grow(pbVar6,uVar17 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar18 = (uint)uVar11 & (uint)uVar19;
        uVar11 = (ulong)uVar18;
        pbVar9->array[uVar17] = pbVar9->array[uVar17] | 1L << (sbyte)uVar18;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 1000);
    pbStack_f0 = (bitset_t *)0x1022cb;
    _Var2 = bitsets_intersect(pbVar3,pbVar6);
    if (_Var2) goto LAB_00102344;
    uVar11 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_f0 = (bitset_t *)0x1022ed;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar6->arraysize < 0x10) {
      pbStack_f0 = (bitset_t *)0x10230c;
      _Var2 = bitset_grow(pbVar6,0x10);
      if (_Var2) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pbStack_f0 = (bitset_t *)0x102322;
    _Var2 = bitsets_intersect(pbVar3,pbVar6);
    if (_Var2) {
      pbStack_f0 = (bitset_t *)0x10232e;
      bitset_free(pbVar3);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pbStack_f0 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_f0 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_f0 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_108 = (code *)0x10235c;
  pbStack_f8 = pbVar3;
  pbStack_f0 = pbVar6;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_108 = (code *)0x102369;
  pbVar6 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_108 = (code *)0x102380;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_108 = (code *)0x10239f;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_108 = (code *)0x1023be;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_108 = (code *)0x1023dd;
    _Var2 = bitset_grow(pbVar6,1);
    if (_Var2) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar6->array = *pbVar6->array | 2;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_108 = (code *)0x1023fc;
    _Var2 = bitset_grow(pbVar6,1);
    if (_Var2) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar6->array = *pbVar6->array | 0x10;
  }
  pcStack_108 = (code *)0x102412;
  _Var2 = bitset_contains_all(pbVar3,pbVar6);
  if (_Var2) {
    pcStack_108 = (code *)0x102421;
    _Var2 = bitset_contains_all(pbVar6,pbVar3);
    if (!_Var2) {
      pcStack_108 = (code *)0x10242d;
      bitset_free(pbVar3);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_108 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_130 = (code *)0x102453;
  pbStack_120 = pbVar3;
  uStack_118 = 1000;
  pbStack_110 = pbVar6;
  pcStack_108 = (code *)uVar11;
  pbVar3 = bitset_create();
  uVar19 = 0;
  pcStack_130 = (code *)0x10245e;
  pbVar6 = bitset_create();
  do {
    uVar17 = uVar19 >> 6;
    if (uVar17 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)uVar19 & 0x3f);
    }
    else {
      pcStack_130 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar17 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar19 & 1) == 0) {
      if (pbVar6->arraysize <= uVar17) {
        pcStack_130 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar6,uVar17 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar6->array[uVar17] = pbVar6->array[uVar17] | 1L << ((byte)uVar19 & 0x3e);
    }
LAB_001024c3:
    uVar19 = uVar19 + 1;
  } while (uVar19 != 1000);
  pcStack_130 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar6);
  if (_Var2) {
    pcStack_130 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar6,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar6->arraysize < 0x10) {
      pcStack_130 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar6,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pcStack_130 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar6);
    if (!_Var2) {
      pcStack_130 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar6,pbVar3);
      if (!_Var2) {
        pcStack_130 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar6);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_130 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_130 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_130 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_130 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar17 = 0;
  pbStack_140 = pbVar3;
  pbStack_138 = pbVar6;
  pcStack_130 = (code *)uVar19;
  pbVar3 = bitset_create();
  do {
    uVar19 = uVar17 >> 6;
    if (uVar19 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100);
  uVar19 = 0x3e6;
  do {
    uVar19 = uVar19 + 2;
    uVar17 = uVar19 >> 6;
    if (uVar17 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)uVar19 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar17 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar19 < 0x44a);
  uVar19 = pbVar3->arraysize;
  if (uVar19 != 0) {
    puVar1 = pbVar3->array;
    uVar11 = 0;
    uVar17 = 0;
    lVar15 = 0;
    do {
      uVar14 = (puVar1[uVar11] >> ((byte)uVar17 & 0x3f)) << ((byte)uVar17 & 0x3f);
      uVar17 = uVar17 & 0xffffffffffffffc0;
      uVar12 = 0;
      do {
        while (uVar14 == 0) {
          uVar11 = uVar11 + 1;
          if (uVar11 == uVar19) {
            lVar16 = lVar15;
            if (uVar12 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar17 = uVar17 + 0x40;
          uVar14 = puVar1[uVar11];
          if (2 < uVar12) goto LAB_0010265a;
        }
        uVar13 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        auStack_168[uVar12 + 1] = uVar13 | uVar17;
        uVar12 = uVar12 + 1;
        uVar14 = uVar14 & uVar14 - 1;
      } while (uVar12 != 3);
      uVar12 = 3;
LAB_0010265a:
      lVar16 = lVar15 + uVar12;
      uVar17 = lVar15 * 2 + 800;
      uVar11 = 0;
      do {
        uVar13 = lVar15 + uVar11;
        if (99 < lVar15 + uVar11) {
          uVar13 = uVar17;
        }
        if (auStack_168[uVar11 + 1] != uVar13) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar11 = uVar11 + 1;
        uVar17 = uVar17 + 2;
      } while (uVar12 != uVar11);
      uVar17 = auStack_168[uVar12] + 1;
      uVar11 = uVar17 >> 6;
      lVar15 = lVar16;
    } while (uVar11 < uVar19);
LAB_001026ac:
    if (lVar16 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar19 = 0;
  pbVar3 = bitset_create();
  do {
    uVar17 = uVar19 >> 6;
    if ((uVar17 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar17 + 1), _Var2)) {
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)uVar19 & 0x3f);
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 100);
  uVar19 = 0x3e6;
  do {
    uVar19 = uVar19 + 2;
    uVar17 = uVar19 >> 6;
    if ((uVar17 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar17 + 1), _Var2)) {
      pbVar3->array[uVar17] = pbVar3->array[uVar17] | 1L << ((byte)uVar19 & 0x3e);
    }
  } while (uVar19 < 0x44a);
  uVar19 = pbVar3->arraysize;
  if (uVar19 != 0) {
    uVar12 = 0;
    uVar11 = 0;
    uVar17 = 0;
    do {
      uVar13 = pbVar3->array[uVar12] >> ((byte)uVar17 & 0x3f);
      if (uVar13 == 0) {
        lVar15 = uVar12 * -0x40;
        do {
          uVar12 = uVar12 + 1;
          if (uVar19 == uVar12) goto LAB_001027db;
          uVar17 = pbVar3->array[uVar12];
          lVar15 = lVar15 + -0x40;
        } while (uVar17 == 0);
        lVar16 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar17 = lVar16 - lVar15;
      }
      else {
        lVar15 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar17 = uVar17 + lVar15;
      }
      uVar12 = uVar11 * 2 + 800;
      if (uVar11 < 100) {
        uVar12 = uVar11;
      }
      if (uVar17 != uVar12) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar11 = uVar11 + 1;
      uVar17 = uVar17 + 1;
      uVar12 = uVar17 >> 6;
    } while (uVar12 < uVar19);
LAB_001027db:
    if (uVar11 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_shift_right() {
  for (size_t sh = 0; sh < 256; sh++) {
    bitset_t *b = bitset_create();
    int power = 3;
    size_t s1 = 100 + sh;
    size_t s2 = s1 + 5000;
    for (size_t k = s1; k < s2; ++k) {
      bitset_set(b, power * k);
    }
    size_t mycount = bitset_count(b);
    bitset_shift_right(b, sh);
    TEST_ASSERT(bitset_count(b) == mycount);
    for (size_t k = s1; k < s2; ++k) {
      TEST_ASSERT(bitset_get(b, power * k - sh));
    }
    bitset_free(b);
  }
}